

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O0

void Parser::MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
               (ParseNodePtr elementNode,anon_class_16_2_de35cfdd handler)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  ParseNodeUni *pPVar4;
  undefined4 *puVar5;
  uint *in_RCX;
  anon_class_16_2_de35cfdd handler_00;
  Parser *local_28;
  ParseNodePtr bindIdentNode;
  ParseNodePtr elementNode_local;
  anon_class_16_2_de35cfdd handler_local;
  
  handler_local.top = (FuncInfo **)handler.i;
  elementNode_local = (ParseNodePtr)handler.top;
  if (elementNode->nop == knopAsg) {
    pPVar3 = ParseNode::AsParseNodeBin(elementNode);
    local_28 = (Parser *)pPVar3->pnode1;
  }
  else {
    local_28 = (Parser *)elementNode;
    if (elementNode->nop == knopEllipsis) {
      pPVar4 = ParseNode::AsParseNodeUni(elementNode);
      local_28 = (Parser *)pPVar4->pnode1;
    }
  }
  bVar2 = ParseNode::IsPattern((ParseNode *)local_28);
  if (bVar2) {
    handler_00.i = in_RCX;
    handler_00.top = handler_local.top;
    MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
              (local_28,elementNode_local,handler_00);
  }
  else {
    bVar2 = ParseNode::IsVarLetOrConst((ParseNode *)local_28);
    if (bVar2) {
      PostVisitFunction::anon_class_16_2_de35cfdd::operator()
                ((anon_class_16_2_de35cfdd *)&elementNode_local,(ParseNode *)local_28);
    }
    else if (*(char *)&(local_28->m_nodeAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_Allocator.outOfMemoryFunc != '\v') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                         ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }